

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::CreateView
          (Relation *this,string *schema_name,string *name,bool replace,bool temporary)

{
  pointer pQVar1;
  long *plVar2;
  undefined7 in_register_00000009;
  size_type *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<duckdb::Relation,_true> sVar5;
  bool temporary_local;
  bool replace_local;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> res;
  string prepended_message;
  shared_ptr<duckdb::CreateViewRelation,_true> view;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  replace_local = temporary;
  enable_shared_from_this<duckdb::Relation>::shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)&local_50);
  prepended_message._M_dataplus._M_p = (pointer)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CreateViewRelation,std::allocator<duckdb::CreateViewRelation>,duckdb::shared_ptr<duckdb::Relation,true>,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,bool&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&prepended_message._M_string_length,
             (CreateViewRelation **)&prepended_message,(allocator<duckdb::CreateViewRelation> *)&res
             ,(shared_ptr<duckdb::Relation,_true> *)&local_50,name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000009,replace),&replace_local,&temporary_local);
  shared_ptr<duckdb::CreateViewRelation,_true>::shared_ptr
            (&view,(shared_ptr<duckdb::CreateViewRelation> *)&prepended_message);
  if (prepended_message._M_string_length != 0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prepended_message._M_string_length);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  shared_ptr<duckdb::CreateViewRelation,_true>::operator->(&view);
  Execute((Relation *)&res);
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->(&res);
  if ((pQVar1->super_BaseQueryResult).success != false) {
    sVar5 = enable_shared_from_this<duckdb::Relation>::shared_from_this
                      ((enable_shared_from_this<duckdb::Relation> *)this);
    _Var4._M_pi = sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (res.super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
        super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
        super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)res.
                            super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                            .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl + 8))
                ();
      _Var4._M_pi = extraout_RDX;
    }
    if (view.internal.super___shared_ptr<duckdb::CreateViewRelation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (view.internal.
                 super___shared_ptr<duckdb::CreateViewRelation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var4._M_pi = extraout_RDX_00;
    }
    sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var4._M_pi;
    sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                   "Failed to create view \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(in_register_00000009,replace));
  plVar2 = (long *)::std::__cxx11::string::append(local_50._M_local_buf);
  prepended_message._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)prepended_message._M_dataplus._M_p == psVar3) {
    prepended_message.field_2._M_allocated_capacity = *psVar3;
    prepended_message.field_2._8_8_ = plVar2[3];
    prepended_message._M_dataplus._M_p = (pointer)&prepended_message.field_2;
  }
  else {
    prepended_message.field_2._M_allocated_capacity = *psVar3;
  }
  prepended_message._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->(&res);
  BaseQueryResult::ThrowError(&pQVar1->super_BaseQueryResult,&prepended_message);
}

Assistant:

shared_ptr<Relation> Relation::CreateView(const string &schema_name, const string &name, bool replace, bool temporary) {
	auto view = make_shared_ptr<CreateViewRelation>(shared_from_this(), schema_name, name, replace, temporary);
	auto res = view->Execute();
	if (res->HasError()) {
		const string prepended_message = "Failed to create view '" + name + "': ";
		res->ThrowError(prepended_message);
	}
	return shared_from_this();
}